

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenWorkItem.cpp
# Opt level: O1

QueuedFullJitWorkItem * __thiscall
CodeGenWorkItem::EnsureQueuedFullJitWorkItem(CodeGenWorkItem *this)

{
  HeapAllocator *this_00;
  QueuedFullJitWorkItem *this_01;
  undefined1 local_40 [8];
  TrackAllocData data;
  
  this_01 = this->queuedFullJitWorkItem;
  if (this_01 == (QueuedFullJitWorkItem *)0x0) {
    local_40 = (undefined1  [8])&QueuedFullJitWorkItem::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_a241e2;
    data.filename._0_4_ = 0xe8;
    this_00 = Memory::HeapAllocator::TrackAllocInfo
                        (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_40);
    this_01 = (QueuedFullJitWorkItem *)Memory::HeapAllocator::AllocT<true>(this_00,0x18);
    QueuedFullJitWorkItem::QueuedFullJitWorkItem(this_01,this);
    this->queuedFullJitWorkItem = this_01;
  }
  return this_01;
}

Assistant:

QueuedFullJitWorkItem *CodeGenWorkItem::EnsureQueuedFullJitWorkItem()
{
    if(queuedFullJitWorkItem)
    {
        return queuedFullJitWorkItem;
    }

    queuedFullJitWorkItem = HeapNewNoThrow(QueuedFullJitWorkItem, this);
    return queuedFullJitWorkItem;
}